

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int client_close_proxy(archive_read_filter *self)

{
  int iVar1;
  long in_RDI;
  uint i;
  int r2;
  int r;
  undefined4 local_1c;
  undefined4 local_14;
  undefined4 local_4;
  
  local_14 = 0;
  if (*(long *)(*(long *)(in_RDI + 0x18) + 0xe0) == 0) {
    local_4 = 0;
  }
  else {
    for (local_1c = 0; local_1c < *(uint *)(*(long *)(in_RDI + 0x18) + 0xf0);
        local_1c = local_1c + 1) {
      iVar1 = (**(code **)(*(long *)(in_RDI + 0x18) + 0xe0))
                        (*(undefined8 *)(in_RDI + 0x18),
                         *(undefined8 *)
                          (*(long *)(*(long *)(in_RDI + 0x18) + 0x100) + (ulong)local_1c * 0x18 +
                          0x10));
      if (iVar1 < local_14) {
        local_14 = iVar1;
      }
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

static int
client_close_proxy(struct archive_read_filter *self)
{
	int r = ARCHIVE_OK, r2;
	unsigned int i;

	if (self->archive->client.closer == NULL)
		return (r);
	for (i = 0; i < self->archive->client.nodes; i++)
	{
		r2 = (self->archive->client.closer)
			((struct archive *)self->archive,
				self->archive->client.dataset[i].data);
		if (r > r2)
			r = r2;
	}
	return (r);
}